

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.cpp
# Opt level: O3

void __thiscall
argo::json_exception::json_exception(json_exception *this,exception_type et,char *json_type_name)

{
  char *__format;
  
  *(undefined ***)this = &PTR__exception_00128b10;
  this->m_type = et;
  switch(et) {
  case not_an_array_e:
    __format = "instance type is %s not array";
    break;
  case not_an_object_e:
    __format = "instance type is %s not object";
    break;
  case not_number_int_or_boolean_e:
    __format = "instance type is %s not integer number or boolean";
    break;
  case not_string_e:
    __format = "instance type is %s not string";
    break;
  default:
    strncpy(this->m_message,"generic",200);
    return;
  case not_number_or_string_e:
    __format = 
    "attempt to set a raw value of an instance of type %s (only works for number and string)";
  }
  snprintf(this->m_message,200,__format,json_type_name);
  return;
}

Assistant:

json_exception::json_exception(exception_type et, const char *json_type_name) noexcept : exception(), m_type(et)
{
    switch (et)
    {
    case not_an_array_e:
        snprintf(m_message, max_message_length, "instance type is %s not array", json_type_name);
        break;
    case not_an_object_e:
        snprintf(m_message, max_message_length, "instance type is %s not object", json_type_name);
        break;
    case not_number_int_or_boolean_e:
        snprintf(m_message, max_message_length, "instance type is %s not integer number or boolean", json_type_name);
        break;
    case not_string_e:
        snprintf(m_message, max_message_length, "instance type is %s not string", json_type_name);
        break;
    case not_number_or_string_e:
        snprintf(m_message, max_message_length, "attempt to set a raw value of an instance of type %s (only works for number and string)", json_type_name);
        break;
    default:
        strncpy(m_message, "generic", max_message_length);
        break;
    }
}